

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSwitch.c
# Opt level: O1

Vec_Int_t * Gia_ManSwiSimulate(Gia_Man_t *pAig,Gia_ParSwi_t *pPars)

{
  Gia_Obj_t *pGVar1;
  size_t __n;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int nTotal;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  Gia_ManSwi_t *p;
  Vec_Int_t *pVVar11;
  int *__s;
  long lVar12;
  uint *pInfo;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  uint *puVar17;
  long lVar18;
  int iVar19;
  Gia_Man_t *pGVar20;
  ulong uVar21;
  ulong uVar22;
  uint *puVar23;
  float fVar24;
  float fVar25;
  double dVar26;
  timespec ts;
  timespec local_70;
  int local_5c;
  Gia_Man_t *local_58;
  ulong local_50;
  long local_48;
  int local_3c;
  long local_38;
  
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    local_38 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_38 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if ((pPars->fProbOne != 0) && (pPars->fProbTrans != 0)) {
    puts(
        "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions."
        );
  }
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    lVar13 = 1;
  }
  else {
    lVar13 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar13 = ((lVar13 >> 7) - (lVar13 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  p = Gia_ManSwiCreate(pAig,pPars);
  if (pPars->fVerbose != 0) {
    iVar4 = pAig->vCis->nSize;
    pGVar20 = p->pAig;
    printf("Obj = %8d (%8d). F = %6d. ",(ulong)(uint)pAig->nObjs,
           (ulong)(uint)(iVar4 + pAig->nObjs + ~(pAig->vCos->nSize + iVar4)),
           (ulong)(uint)pGVar20->nFront);
    dVar26 = (double)p->nWords * 4.0;
    iVar4 = 0x990963;
    printf("AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ",
           (double)pGVar20->nObjs * 12.0 * 9.5367431640625e-07,
           (double)pGVar20->nFront * dVar26 * 9.5367431640625e-07,
           (double)(pGVar20->vCos->nSize + pGVar20->vCis->nSize) * dVar26 * 9.5367431640625e-07);
    Abc_Print(iVar4,"%s =","Time");
    iVar15 = 3;
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar14 + lVar13) / 1000000.0);
  }
  Gia_ManRandom(1);
  local_58 = p->pAig;
  pVVar11 = local_58->vCis;
  uVar21 = 0;
  if (local_58->nRegs < pVVar11->nSize) {
    puVar23 = p->pDataSimCis;
    uVar10 = p->nWords;
    uVar21 = 0;
    do {
      lVar13 = (ulong)uVar10 + 1;
      if (0 < (int)uVar10) {
        do {
          uVar5 = Gia_ManRandom(0);
          puVar23[lVar13 + -2] = uVar5;
          lVar13 = lVar13 + -1;
        } while (1 < lVar13);
      }
      uVar21 = uVar21 + 1;
      pVVar11 = local_58->vCis;
      puVar23 = puVar23 + (int)uVar10;
    } while ((long)uVar21 < (long)pVVar11->nSize - (long)local_58->nRegs);
  }
  if ((int)uVar21 < pVVar11->nSize) {
    iVar4 = p->nWords;
    __n = (long)iVar4 * 4;
    uVar21 = uVar21 & 0xffffffff;
    lVar13 = (long)iVar4 * uVar21 * 4;
    do {
      if (0 < iVar4) {
        memset((void *)((long)p->pDataSimCis + lVar13),0,__n);
      }
      uVar21 = uVar21 + 1;
      lVar13 = lVar13 + __n;
    } while ((long)uVar21 < (long)pVVar11->nSize);
  }
  if (0 < pPars->nIters) {
    local_50 = 0;
    pGVar20 = local_58;
    do {
      if (pGVar20->nFront < 1) {
        __assert_fail("p->pAig->nFront > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                      ,0x1dd,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
      }
      pGVar2 = pGVar20->pObjs;
      if (pGVar2->Value != 0) {
        __assert_fail("Gia_ManConst0(p->pAig)->Value == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                      ,0x1de,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
      }
      iVar4 = pPars->nPref;
      puVar23 = p->pDataSim;
      uVar10 = p->nWords;
      lVar13 = (long)(int)uVar10;
      uVar21 = (ulong)uVar10;
      if (0 < lVar13) {
        memset(puVar23,0,uVar21 * 4);
      }
      if (1 < pGVar20->nObjs) {
        lVar14 = uVar21 + 1;
        lVar12 = 1;
        do {
          pGVar1 = pGVar2 + lVar12;
          uVar22 = *(ulong *)pGVar1;
          uVar5 = (uint)uVar22;
          uVar6 = (uint)(uVar22 >> 0x20);
          if ((int)uVar5 < 0) {
            uVar7 = pGVar1->Value;
            if ((~uVar5 & 0x1fffffff) == 0) {
              if (pGVar20->nFront <= (int)uVar7) {
                __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                              ,0x1ef,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
              }
              if (0 < (int)uVar10) {
                puVar17 = p->pDataSimCis;
                lVar18 = lVar14;
                do {
                  puVar23[(long)(int)(uVar7 * uVar10) + lVar18 + -2] =
                       puVar17[(long)(int)((uVar6 & 0x1fffffff) * uVar10) + lVar18 + -2];
                  lVar18 = lVar18 + -1;
                } while (1 < lVar18);
              }
            }
            else {
              if (uVar7 != 0x1fffffff) {
                __assert_fail("Gia_ObjValue(pObj) == GIA_NONE",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                              ,0x1e9,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
              }
              iVar15 = (uVar6 & 0x1fffffff) * uVar10;
              iVar16 = (uVar5 & 0x1fffffff) * uVar10;
              puVar17 = p->pDataSimCos;
              if ((uVar5 >> 0x1d & 1) == 0) {
                lVar18 = lVar14;
                if (0 < (int)uVar10) {
                  do {
                    puVar17[(long)iVar15 + lVar18 + -2] = puVar23[(long)iVar16 + lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              else {
                lVar18 = lVar14;
                if (0 < (int)uVar10) {
                  do {
                    puVar17[(long)iVar15 + lVar18 + -2] = ~puVar23[(long)iVar16 + lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
            }
          }
          else {
            if (pGVar20->nFront <= (int)pGVar1->Value) {
              __assert_fail("Gia_ObjValue(pObj) < p->pAig->nFront",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                            ,0x1e4,"void Gia_ManSwiSimulateRound(Gia_ManSwi_t *, int)");
            }
            iVar15 = pGVar1->Value * uVar10;
            iVar16 = (uVar5 & 0x1fffffff) * uVar10;
            iVar19 = (uVar6 & 0x1fffffff) * uVar10;
            if ((uVar5 >> 0x1d & 1) == 0) {
              if ((uVar22 >> 0x3d & 1) == 0) {
                lVar18 = lVar14;
                if (0 < (int)uVar10) {
                  do {
                    puVar23[(long)iVar15 + lVar18 + -2] =
                         puVar23[(long)iVar19 + lVar18 + -2] & puVar23[(long)iVar16 + lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
              else {
                lVar18 = lVar14;
                if (0 < (int)uVar10) {
                  do {
                    puVar23[(long)iVar15 + lVar18 + -2] =
                         ~puVar23[(long)iVar19 + lVar18 + -2] & puVar23[(long)iVar16 + lVar18 + -2];
                    lVar18 = lVar18 + -1;
                  } while (1 < lVar18);
                }
              }
            }
            else if ((uVar22 >> 0x3d & 1) == 0) {
              lVar18 = lVar14;
              if (0 < (int)uVar10) {
                do {
                  puVar23[(long)iVar15 + lVar18 + -2] =
                       ~puVar23[(long)iVar16 + lVar18 + -2] & puVar23[(long)iVar19 + lVar18 + -2];
                  lVar18 = lVar18 + -1;
                } while (1 < lVar18);
              }
            }
            else {
              lVar18 = lVar14;
              if (0 < (int)uVar10) {
                do {
                  puVar23[(long)iVar15 + lVar18 + -2] =
                       ~(puVar23[(long)iVar19 + lVar18 + -2] | puVar23[(long)iVar16 + lVar18 + -2]);
                  lVar18 = lVar18 + -1;
                } while (1 < lVar18);
              }
            }
          }
          if ((iVar4 <= (int)local_50) &&
             (-1 < (int)*(uint *)pGVar1 || (~*(uint *)pGVar1 & 0x1fffffff) == 0)) {
            iVar15 = pGVar1->Value * uVar10;
            if (p->pPars->fProbTrans == 0) {
              if ((int)uVar10 < 1) goto LAB_00778abd;
              iVar16 = 0;
              lVar18 = lVar14;
              do {
                uVar5 = (puVar23[(long)iVar15 + lVar18 + -2] >> 1 & 0x55555555) +
                        (puVar23[(long)iVar15 + lVar18 + -2] & 0x55555555);
                uVar5 = (uVar5 >> 2 & 0x33333333) + (uVar5 & 0x33333333);
                uVar5 = (uVar5 >> 4 & 0x7070707) + (uVar5 & 0x7070707);
                uVar5 = (uVar5 >> 8 & 0xf000f) + (uVar5 & 0xf000f);
                iVar16 = (uVar5 >> 0x10) + iVar16 + (uVar5 & 0xffff);
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
            else if ((int)uVar10 < 1) {
LAB_00778abd:
              iVar16 = 0;
            }
            else {
              iVar16 = 0;
              lVar18 = lVar14;
              do {
                uVar5 = puVar23[(long)iVar15 + lVar18 + -2] >> 0x10 ^
                        puVar23[(long)iVar15 + lVar18 + -2];
                uVar5 = (uVar5 >> 1 & 0x5555) + (uVar5 & 0x5555);
                uVar5 = (uVar5 >> 2 & 0x3333) + (uVar5 & 0x3333);
                uVar5 = (uVar5 >> 4 & 0x707) + (uVar5 & 0x707);
                iVar16 = iVar16 + ((uVar5 >> 8) + (uVar5 & 0xff)) * 2;
                lVar18 = lVar18 + -1;
              } while (1 < lVar18);
            }
            p->pData1[lVar12] = p->pData1[lVar12] + iVar16;
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < pGVar20->nObjs);
      }
      if ((int)local_50 == pPars->nIters + -1) break;
      pVVar11 = pGVar20->vCis;
      local_5c = pVVar11->nSize;
      if (pPars->fProbTrans == 0) {
        iVar4 = pGVar20->vCos->nSize;
        if (pGVar20->nRegs < local_5c) {
          iVar15 = pPars->nRandPiFactor;
          puVar23 = p->pDataSimCis;
          lVar14 = uVar21 + 1;
          local_48 = lVar13 * 4;
          uVar22 = 0;
          local_3c = iVar4;
          do {
            if (iVar15 == -1) {
              uVar5 = Gia_ManRandom(0);
              uVar6 = Gia_ManRandom(0);
              uVar7 = Gia_ManRandom(0);
              uVar8 = Gia_ManRandom(0);
              uVar9 = Gia_ManRandom(0);
              if (0 < (int)uVar10) {
                lVar12 = lVar14;
                do {
                  puVar23[lVar12 + -2] =
                       puVar23[lVar12 + -2] ^ (uVar8 & uVar7 & uVar9 | uVar6 & uVar5);
                  lVar12 = lVar12 + -1;
                } while (1 < lVar12);
              }
            }
            else if (iVar15 < 1) {
              if (iVar15 != 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                              ,0xac,
                              "void Gia_ManSwiSimInfoRandom(Gia_ManSwi_t *, unsigned int *, int)");
              }
              lVar12 = lVar14;
              if (0 < (int)uVar10) {
                do {
                  uVar5 = Gia_ManRandom(0);
                  puVar23[lVar12 + -2] = uVar5;
                  lVar12 = lVar12 + -1;
                } while (1 < lVar12);
              }
            }
            else {
              uVar5 = Gia_ManRandom(0);
              iVar4 = iVar15;
              do {
                uVar6 = Gia_ManRandom(0);
                uVar5 = uVar5 & uVar6;
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
              lVar12 = lVar14;
              if (0 < (int)uVar10) {
                do {
                  puVar23[lVar12 + -2] = puVar23[lVar12 + -2] ^ uVar5;
                  lVar12 = lVar12 + -1;
                } while (1 < lVar12);
              }
            }
            uVar22 = uVar22 + 1;
            pVVar11 = local_58->vCis;
            puVar23 = (uint *)((long)puVar23 + local_48);
            pGVar20 = local_58;
            iVar4 = local_3c;
          } while ((long)uVar22 < (long)pVVar11->nSize - (long)local_58->nRegs);
        }
        else {
          uVar22 = 0;
        }
        if ((int)uVar22 < pVVar11->nSize) {
          uVar22 = uVar22 & 0xffffffff;
          puVar17 = (uint *)(lVar13 * 4 * uVar22 + (long)p->pDataSimCis);
          puVar23 = p->pDataSimCos + ((long)(iVar4 - local_5c) + uVar22) * lVar13;
          do {
            lVar14 = uVar21 + 1;
            if (0 < (int)uVar10) {
              do {
                puVar17[lVar14 + -2] = puVar23[lVar14 + -2];
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            uVar22 = uVar22 + 1;
            puVar17 = puVar17 + lVar13;
            puVar23 = puVar23 + lVar13;
          } while ((long)uVar22 < (long)pVVar11->nSize);
        }
      }
      else {
        iVar4 = pGVar20->vCos->nSize;
        if (pGVar20->nRegs < local_5c) {
          iVar15 = pPars->nRandPiFactor;
          puVar23 = p->pDataSimCis;
          local_48 = lVar13 * 4;
          uVar22 = 0;
          do {
            if (iVar15 == -1) {
              uVar5 = Gia_ManRandom(0);
              uVar6 = Gia_ManRandom(0);
              uVar7 = Gia_ManRandom(0);
              uVar8 = Gia_ManRandom(0);
              uVar9 = Gia_ManRandom(0);
              uVar5 = uVar9 & uVar8 & uVar7 | uVar6 & uVar5;
              pGVar20 = local_58;
            }
            else {
              if (iVar15 < 0) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSwitch.c"
                              ,0xca,
                              "void Gia_ManSwiSimInfoRandomShift(Gia_ManSwi_t *, unsigned int *, int)"
                             );
              }
              uVar5 = Gia_ManRandom(0);
              for (iVar16 = iVar15; iVar16 != 0; iVar16 = iVar16 + -1) {
                uVar6 = Gia_ManRandom(0);
                uVar5 = uVar5 & uVar6;
              }
            }
            lVar14 = uVar21 + 1;
            if (0 < (int)uVar10) {
              do {
                puVar23[lVar14 + -2] =
                     (puVar23[lVar14 + -2] ^ uVar5) & 0xffff | puVar23[lVar14 + -2] << 0x10;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            uVar22 = uVar22 + 1;
            pVVar11 = pGVar20->vCis;
            puVar23 = (uint *)((long)puVar23 + local_48);
          } while ((long)uVar22 < (long)pVVar11->nSize - (long)pGVar20->nRegs);
        }
        else {
          uVar22 = 0;
        }
        if ((int)uVar22 < pVVar11->nSize) {
          uVar22 = uVar22 & 0xffffffff;
          puVar23 = p->pDataSimCos + ((long)(iVar4 - local_5c) + uVar22) * lVar13;
          puVar17 = (uint *)(lVar13 * 4 * uVar22 + (long)p->pDataSimCis);
          do {
            lVar14 = uVar21 + 1;
            if (0 < (int)uVar10) {
              do {
                puVar17[lVar14 + -2] =
                     (uint)(ushort)puVar23[lVar14 + -2] | puVar17[lVar14 + -2] << 0x10;
                lVar14 = lVar14 + -1;
              } while (1 < lVar14);
            }
            uVar22 = uVar22 + 1;
            puVar23 = puVar23 + lVar13;
            puVar17 = puVar17 + lVar13;
          } while ((long)uVar22 < (long)pVVar11->nSize);
        }
      }
      uVar10 = (int)local_50 + 1;
      local_50 = (ulong)uVar10;
    } while ((int)uVar10 < pPars->nIters);
  }
  if (pPars->fVerbose != 0) {
    iVar4 = 0x990999;
    printf("Simulated %d frames with %d words. ",(ulong)(uint)pPars->nIters,
           (ulong)(uint)pPars->nWords);
    Abc_Print(iVar4,"%s =","Simulation time");
    iVar15 = 3;
    iVar4 = clock_gettime(3,&local_70);
    if (iVar4 < 0) {
      lVar13 = -1;
    }
    else {
      lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    Abc_Print(iVar15,"%9.2f sec\n",(double)(lVar13 + local_38) / 1000000.0);
  }
  uVar10 = pAig->nObjs;
  uVar21 = (ulong)uVar10;
  pVVar11 = (Vec_Int_t *)malloc(0x10);
  uVar5 = 0x10;
  if (0xe < uVar10 - 1) {
    uVar5 = uVar10;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = uVar5;
  if (uVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)(int)uVar5 << 2);
  }
  pVVar11->pArray = __s;
  pVVar11->nSize = uVar10;
  memset(__s,0,(long)(int)uVar10 * 4);
  if (pPars->fProbOne == 0) {
    if (pPars->fProbTrans == 0) {
      if ((0 < (int)uVar10) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
        piVar3 = p->pData1;
        iVar4 = (pPars->nIters - pPars->nPref) * pPars->nWords * 0x20;
        fVar24 = (float)iVar4;
        uVar22 = 0;
        do {
          fVar25 = (float)piVar3[uVar22];
          __s[uVar22] = (int)(((float)(iVar4 - piVar3[uVar22]) * ((fVar25 + fVar25) / fVar24)) /
                             fVar24);
          uVar22 = uVar22 + 1;
        } while (uVar21 != uVar22);
      }
    }
    else if ((0 < (int)uVar10) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      iVar4 = pPars->nIters;
      iVar15 = pPars->nPref;
      piVar3 = p->pData1;
      iVar16 = pPars->nWords;
      uVar22 = 0;
      do {
        __s[uVar22] = (int)((float)piVar3[uVar22] / (float)((iVar4 - iVar15) * iVar16 * 0x20));
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
  }
  else {
    if ((0 < (int)uVar10) && (pAig->pObjs != (Gia_Obj_t *)0x0)) {
      iVar4 = pPars->nIters;
      iVar15 = pPars->nPref;
      piVar3 = p->pData1;
      iVar16 = pPars->nWords;
      uVar22 = 0;
      do {
        __s[uVar22] = (int)((float)piVar3[uVar22] / (float)((iVar4 - iVar15) * iVar16 * 0x20));
        uVar22 = uVar22 + 1;
      } while (uVar21 != uVar22);
    }
    lVar13 = (long)pAig->vCos->nSize;
    if (0 < lVar13) {
      piVar3 = pAig->vCos->pArray;
      lVar14 = 0;
      do {
        iVar4 = piVar3[lVar14];
        lVar12 = (long)iVar4;
        if ((lVar12 < 0) || ((int)uVar10 <= iVar4)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar2 = pAig->pObjs;
        if (pGVar2 == (Gia_Obj_t *)0x0) break;
        uVar5 = (uint)*(undefined8 *)(pGVar2 + lVar12);
        pGVar1 = pGVar2 + lVar12 + -(ulong)(uVar5 & 0x1fffffff);
        if ((uVar5 >> 0x1d & 1) == 0) {
          if ((pGVar2 + (int)uVar10 <= pGVar1 || pGVar1 < pGVar2) || ((int)uVar10 <= iVar4)) {
LAB_0077920c:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                          ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          fVar24 = (float)__s[(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555];
        }
        else {
          if ((pGVar2 + (int)uVar10 <= pGVar1 || pGVar1 < pGVar2) || ((int)uVar10 <= iVar4))
          goto LAB_0077920c;
          fVar24 = 1.0 - (float)__s[(int)((ulong)((long)pGVar1 - (long)pGVar2) >> 2) * -0x55555555];
        }
        __s[lVar12] = (int)fVar24;
        lVar14 = lVar14 + 1;
      } while (lVar13 != lVar14);
    }
  }
  Gia_ManSwiDelete(p);
  return pVVar11;
}

Assistant:

Vec_Int_t * Gia_ManSwiSimulate( Gia_Man_t * pAig, Gia_ParSwi_t * pPars )
{
    Gia_ManSwi_t * p;
    Gia_Obj_t * pObj;
    Vec_Int_t * vSwitching;
    float * pSwitching;
    int i;
    abctime clk, clkTotal = Abc_Clock();
    if ( pPars->fProbOne && pPars->fProbTrans )
        printf( "Conflict of options: Can either compute probability of 1, or probability of switching by observing transitions.\n" );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManSwiCreate( pAig, pPars );
    if ( pPars->fVerbose )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*p->nWords*p->pAig->nFront/(1<<20), 
            4.0*p->nWords*(Gia_ManCiNum(p->pAig) + Gia_ManCoNum(p->pAig))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManRandom( 1 );
    Gia_ManSwiSimInfoInit( p );
    for ( i = 0; i < pPars->nIters; i++ )
    {
        Gia_ManSwiSimulateRound( p, i >= pPars->nPref );
        if ( i == pPars->nIters - 1 )
            break;
        if ( pPars->fProbTrans )
            Gia_ManSwiSimInfoTransferShift( p, pPars->nRandPiFactor );
        else
            Gia_ManSwiSimInfoTransfer( p, pPars->nRandPiFactor );
    }
    if ( pPars->fVerbose )
    {
        printf( "Simulated %d frames with %d words. ", pPars->nIters, pPars->nWords );
        ABC_PRT( "Simulation time", Abc_Clock() - clkTotal );
    }
    // derive the result
    vSwitching = Vec_IntStart( Gia_ManObjNum(pAig) );
    pSwitching = (float *)vSwitching->pArray;
    if ( pPars->fProbOne )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
        Gia_ManForEachCo( pAig, pObj, i )
        {
            if ( Gia_ObjFaninC0(pObj) )
                pSwitching[Gia_ObjId(pAig,pObj)] = (float)1.0-pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
            else
                pSwitching[Gia_ObjId(pAig,pObj)] = pSwitching[Gia_ObjId(pAig,Gia_ObjFanin0(pObj))];
        }
    }
    else if ( pPars->fProbTrans )
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeProbOne( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
    else
    {
        Gia_ManForEachObj( pAig, pObj, i )
            pSwitching[i] = Gia_ManSwiComputeSwitching( p->pData1[i], pPars->nWords*(pPars->nIters-pPars->nPref) );
    }
/*
    printf( "PI: " );
    Gia_ManForEachPi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LO: " );
    Gia_ManForEachRo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "PO: " );
    Gia_ManForEachPo( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );

    printf( "LI: " );
    Gia_ManForEachRi( pAig, pObj, i )
        printf( "%d=%d (%f)  ", i, p->pData1[Gia_ObjId(pAig,pObj)], pSwitching[Gia_ObjId(pAig,pObj)] );
    printf( "\n" );
*/
    Gia_ManSwiDelete( p );
    return vSwitching;

}